

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::internal::assign_op<double,double>>
               (Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false> *dst,
               Array<double,__1,_1,_0,__1,_1> *src,assign_op<double,_double> *func)

{
  undefined8 func_00;
  Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false> *dstExpr;
  undefined1 local_78 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  Array<double,__1,_1,_0,__1,_1> *src_local;
  Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false> *dst_local;
  
  srcEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>.
  _8_8_ = func;
  evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::evaluator
            ((evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_30,src);
  resize_if_allowed<Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Array<double,_1,1,0,_1,1>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                     ._8_8_);
  evaluator<Eigen::Block<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>._8_8_;
  dstExpr = EigenBase<Eigen::Block<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_78,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_78);
  evaluator<Eigen::Block<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &kernel.m_dstExpr);
  evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::~evaluator
            ((evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}